

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::_::Void>::ImmediatePromiseNode
          (ImmediatePromiseNode<kj::_::Void> *this,ExceptionOr<kj::_::Void> *result)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  ExceptionOr<kj::_::Void> *result_local;
  ImmediatePromiseNode<kj::_::Void> *this_local;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00bf6600;
  pEVar1 = mv<kj::_::ExceptionOr<kj::_::Void>>(result);
  ExceptionOr<kj::_::Void>::ExceptionOr(&this->result,pEVar1);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}